

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

JavascriptFunction * __thiscall
Js::ScriptContext::LoadScript
          (ScriptContext *this,byte *script,size_t cb,SRCINFO *pSrcInfo,CompileScriptException *pse,
          Utf8SourceInfo **ppSourceInfo,char16 *rootDisplayName,LoadScriptFlag loadScriptFlag,
          Var scriptSource)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptFunction *pJVar4;
  undefined1 local_af8 [8];
  Parser parser;
  AutoDynamicCodeReference dynamicFunctionReference;
  AutoNestedHandledExceptionType local_34 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if (this->threadContext->isScriptActive == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0xa21,"(!this->threadContext->IsScriptActive())",
                                "!this->threadContext->IsScriptActive()");
    if (!bVar2) goto LAB_006ef283;
    *puVar3 = 0;
  }
  if (pse == (CompileScriptException *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0xa22,"(pse != nullptr)","pse != nullptr");
    if (!bVar2) {
LAB_006ef283:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_34,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  parser._2720_8_ = this;
  JavascriptLibrary::BeginDynamicFunctionReferences
            ((this->super_ScriptContextBase).javascriptLibrary);
  Parser::Parser((Parser *)local_af8,this,0,(PageAllocator *)0x0,false,0xaa8);
  pJVar4 = LoadScriptInternal(this,(Parser *)local_af8,script,cb,pSrcInfo,pse,ppSourceInfo,
                              rootDisplayName,loadScriptFlag,scriptSource);
  Parser::~Parser((Parser *)local_af8);
  AutoDynamicCodeReference::~AutoDynamicCodeReference
            ((AutoDynamicCodeReference *)&parser.m_deferringAST);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_34);
  return pJVar4;
}

Assistant:

JavascriptFunction* ScriptContext::LoadScript(const byte* script, size_t cb,
        SRCINFO const * pSrcInfo, CompileScriptException * pse, Utf8SourceInfo** ppSourceInfo,
        const char16 *rootDisplayName, LoadScriptFlag loadScriptFlag, Js::Var scriptSource)
    {
        Assert(!this->threadContext->IsScriptActive());
        Assert(pse != nullptr);
        HRESULT hr = NOERROR;
        try
        {
            AUTO_NESTED_HANDLED_EXCEPTION_TYPE((ExceptionType)(ExceptionType_OutOfMemory | ExceptionType_StackOverflow));
            Js::AutoDynamicCodeReference dynamicFunctionReference(this);
            Parser parser(this);
            return LoadScriptInternal(&parser, script, cb, pSrcInfo, pse, ppSourceInfo, rootDisplayName, loadScriptFlag, scriptSource);
        }
        catch (Js::OutOfMemoryException)
        {
            hr = E_OUTOFMEMORY;
        }
        catch (Js::StackOverflowException)
        {
            hr = VBSERR_OutOfStack;
        }
        pse->ProcessError(nullptr, hr, nullptr);
        return nullptr;
    }